

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  BeagleCPUImpl<double,_1,_0> *pBVar7;
  pointer pdVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  int j;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_89;
  double *local_88;
  double *local_80;
  double local_78;
  double *local_70;
  BeagleCPUImpl<double,_1,_0> *local_68;
  long local_60;
  double *local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 auVar26 [64];
  
  if (0 < this->kPatternCount) {
    lVar18 = 0;
    lVar17 = 0;
    local_88 = preOrderPartial;
    local_80 = postOrderPartial;
    local_78 = edgeLength;
    local_70 = outCrossProducts;
    local_68 = this;
    local_58 = categoryRates;
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_50,&local_89)
      ;
      pBVar7 = local_68;
      iVar4 = this->kCategoryCount;
      if ((long)iVar4 < 1) {
        dVar21 = 0.0;
      }
      else {
        iVar5 = this->kPatternCount;
        lVar9 = (long)this->kPartialsPaddedStateCount;
        uVar6 = this->kStateCount;
        uVar11 = (ulong)uVar6;
        pdVar13 = (double *)((long)local_80 + lVar18 * lVar9);
        lVar14 = iVar5 * lVar9;
        pdVar12 = (double *)(lVar18 * lVar9 + (long)local_88);
        auVar20 = ZEXT864(0) << 0x40;
        lVar15 = 0;
        do {
          auVar26 = ZEXT864(0) << 0x40;
          auVar25 = auVar26._0_16_;
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              auVar22._8_8_ = 0;
              auVar22._0_8_ = pdVar13[uVar10];
              auVar25._8_8_ = 0;
              auVar25._0_8_ = pdVar12[uVar10];
              auVar25 = vfmadd231sd_fma(auVar26._0_16_,auVar22,auVar25);
              auVar26 = ZEXT1664(auVar25);
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
          dVar21 = categoryWeights[lVar15];
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar21;
          if (0 < (int)uVar6) {
            dVar1 = local_58[lVar15];
            uVar10 = 0;
            pdVar8 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              uVar16 = 0;
              do {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = pdVar8[uVar16];
                auVar27._8_8_ = 0;
                auVar27._0_8_ = local_78 * dVar1;
                auVar28._8_8_ = 0;
                auVar28._0_8_ =
                     dVar21 * local_88[(lVar15 * iVar5 + lVar17) * lVar9 + uVar10] * pdVar13[uVar16]
                ;
                auVar22 = vfmadd213sd_fma(auVar28,auVar27,auVar2);
                pdVar8[uVar16] = auVar22._0_8_;
                uVar16 = uVar16 + 1;
              } while (uVar11 != uVar16);
              uVar10 = uVar10 + 1;
              pdVar8 = pdVar8 + (int)uVar6;
            } while (uVar10 != uVar11);
          }
          auVar25 = vfmadd213sd_fma(auVar23,auVar25,auVar20._0_16_);
          dVar21 = auVar25._0_8_;
          lVar15 = lVar15 + 1;
          pdVar13 = pdVar13 + lVar14;
          pdVar12 = pdVar12 + lVar14;
          auVar20 = ZEXT1664(auVar25);
        } while (lVar15 != iVar4);
      }
      lVar9 = (long)local_68->kStateCount;
      if (0 < lVar9) {
        auVar19._0_8_ = local_68->gPatternWeights[lVar17] / dVar21;
        auVar19._8_8_ = 0;
        lVar14 = 0;
        pdVar8 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar12 = local_70;
        do {
          lVar15 = 0;
          do {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = pdVar8[lVar15];
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar12[lVar15];
            auVar25 = vfmadd213sd_fma(auVar24,auVar19,auVar3);
            pdVar12[lVar15] = auVar25._0_8_;
            lVar15 = lVar15 + 1;
          } while (lVar9 != lVar15);
          lVar14 = lVar14 + 1;
          pdVar12 = pdVar12 + lVar9;
          pdVar8 = pdVar8 + lVar9;
        } while (lVar14 != lVar9);
      }
      local_60 = lVar18;
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 8;
      this = pBVar7;
    } while (lVar17 < pBVar7->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}